

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O1

void __thiscall DOptionMenu::Init(DOptionMenu *this,DMenu *parent,FOptionMenuDescriptor *desc)

{
  int iVar1;
  
  (this->super_DMenu).mParentMenu.field_0.p = parent;
  if (((parent != (DMenu *)0x0) && (((parent->super_DObject).ObjectFlags & 3) != 0)) &&
     (((this->super_DMenu).super_DObject.ObjectFlags & 4) != 0)) {
    GC::Barrier((DObject *)this,&parent->super_DObject);
  }
  this->mDesc = desc;
  if ((desc != (FOptionMenuDescriptor *)0x0) && (desc->mSelectedItem == -1)) {
    iVar1 = FirstSelectable(this);
    this->mDesc->mSelectedItem = iVar1;
  }
  return;
}

Assistant:

void DOptionMenu::Init(DMenu *parent, FOptionMenuDescriptor *desc)
{
	mParentMenu = parent;
	GC::WriteBarrier(this, parent);
	mDesc = desc;
	if (mDesc != NULL && mDesc->mSelectedItem == -1) mDesc->mSelectedItem = FirstSelectable();

}